

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

int __thiscall rr::TriangleRasterizer::init(TriangleRasterizer *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  deInt64 *pdVar2;
  Winding WVar3;
  HorizontalFill HVar4;
  VerticalFill VVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  float *in_RCX;
  long lVar13;
  int iVar14;
  float *in_RDX;
  long lVar15;
  int iVar16;
  bool bVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  uint uVar30;
  
  uVar10 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar10;
  uVar10 = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar10;
  uVar10 = *(undefined8 *)(in_RCX + 2);
  *(undefined8 *)(this->m_v2).m_data = *(undefined8 *)in_RCX;
  *(undefined8 *)((this->m_v2).m_data + 2) = uVar10;
  uVar30 = -(uint)(*(float *)ctx < 0.0);
  lVar21 = (long)(*(float *)ctx * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000));
  uVar30 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar23 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000))
  ;
  uVar30 = -(uint)(*in_RDX < 0.0);
  lVar19 = (long)(*in_RDX * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000));
  uVar30 = -(uint)(in_RDX[1] < 0.0);
  lVar11 = (long)(in_RDX[1] * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000));
  uVar30 = -(uint)(*in_RCX < 0.0);
  lVar13 = (long)(*in_RCX * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000));
  uVar30 = -(uint)(in_RCX[1] < 0.0);
  lVar15 = (long)(in_RCX[1] * 256.0 + (float)(~uVar30 & 0x3f000000 | uVar30 & 0xbf000000));
  WVar3 = this->m_winding;
  HVar4 = this->m_horizontalFill;
  VVar5 = this->m_verticalFill;
  if (WVar3 == WINDING_CCW) {
    lVar27 = lVar19 - lVar21;
    if (lVar11 == lVar23) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar11 - lVar23 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar11 == lVar23 || bVar29;
      }
    }
    (this->m_edge01).a = lVar23 - lVar11;
    (this->m_edge01).b = lVar27;
    (this->m_edge01).c = lVar11 * lVar21 - lVar19 * lVar23;
    (this->m_edge01).inclusive = bVar17;
    lVar27 = lVar13 - lVar19;
    if (lVar15 == lVar11) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar15 - lVar11 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar15 == lVar11 || bVar29;
      }
    }
    (this->m_edge12).a = lVar11 - lVar15;
    (this->m_edge12).b = lVar27;
    (this->m_edge12).c = lVar15 * lVar19 - lVar13 * lVar11;
    (this->m_edge12).inclusive = bVar17;
    lVar27 = lVar21 - lVar13;
    if (lVar23 == lVar15) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar23 - lVar15 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar23 == lVar15 || bVar29;
      }
    }
    (this->m_edge20).a = lVar15 - lVar23;
    (this->m_edge20).b = lVar27;
    lVar28 = lVar13 * lVar23;
    lVar27 = lVar15 * lVar21;
  }
  else {
    lVar27 = lVar21 - lVar19;
    if (lVar23 == lVar11) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar23 - lVar11 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar23 == lVar11 || bVar29;
      }
    }
    (this->m_edge01).a = lVar11 - lVar23;
    (this->m_edge01).b = lVar27;
    (this->m_edge01).c = lVar19 * lVar23 - lVar11 * lVar21;
    (this->m_edge01).inclusive = bVar17;
    lVar27 = lVar19 - lVar13;
    if (lVar11 == lVar15) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar11 - lVar15 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar11 == lVar15 || bVar29;
      }
    }
    (this->m_edge12).a = lVar15 - lVar11;
    (this->m_edge12).b = lVar27;
    (this->m_edge12).c = lVar13 * lVar11 - lVar15 * lVar19;
    (this->m_edge12).inclusive = bVar17;
    lVar27 = lVar13 - lVar21;
    if (lVar15 == lVar23) {
      bVar17 = lVar27 < 1;
      if (VVar5 == FILL_BOTTOM) {
        bVar17 = -1 < lVar27;
      }
    }
    else {
      bVar29 = lVar15 - lVar23 < 0;
      bVar17 = !bVar29;
      if (HVar4 == FILL_LEFT) {
        bVar17 = lVar15 == lVar23 || bVar29;
      }
    }
    (this->m_edge20).a = lVar23 - lVar15;
    (this->m_edge20).b = lVar27;
    lVar28 = lVar15 * lVar21;
    lVar27 = lVar13 * lVar23;
  }
  lVar7 = (this->m_edge01).a;
  lVar8 = (this->m_edge01).b;
  lVar9 = (this->m_edge01).c;
  lVar26 = lVar8 * lVar15 + lVar7 * lVar13 + lVar9;
  (this->m_edge20).c = lVar28 - lVar27;
  bVar29 = lVar26 < 0;
  if (WVar3 == WINDING_CCW) {
    bVar29 = 0 < lVar26;
  }
  (this->m_edge20).inclusive = bVar17;
  this->m_face = (uint)(byte)(this->m_viewportOrientation != VIEWPORTORIENTATION_UPPER_LEFT ^ bVar29
                             );
  if (bVar29 == false) {
    (this->m_edge01).a = -lVar7;
    (this->m_edge01).b = -lVar8;
    (this->m_edge01).c = -lVar9;
    pbVar1 = &(this->m_edge01).inclusive;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    (this->m_edge12).a = -(this->m_edge12).a;
    pdVar2 = &(this->m_edge12).b;
    *pdVar2 = -*pdVar2;
    pdVar2 = &(this->m_edge12).c;
    *pdVar2 = -*pdVar2;
    pbVar1 = &(this->m_edge12).inclusive;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    (this->m_edge20).a = -(this->m_edge20).a;
    pdVar2 = &(this->m_edge20).b;
    *pdVar2 = -*pdVar2;
    pdVar2 = &(this->m_edge20).c;
    *pdVar2 = -*pdVar2;
    pbVar1 = &(this->m_edge20).inclusive;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
  }
  lVar27 = lVar19;
  if (lVar21 < lVar19) {
    lVar27 = lVar21;
  }
  if (lVar19 < lVar21) {
    lVar19 = lVar21;
  }
  if (lVar13 <= lVar27) {
    lVar27 = lVar13;
  }
  if (lVar19 <= lVar13) {
    lVar19 = lVar13;
  }
  lVar13 = lVar11;
  if (lVar23 < lVar11) {
    lVar13 = lVar23;
  }
  if (lVar11 < lVar23) {
    lVar11 = lVar23;
  }
  if (lVar15 <= lVar13) {
    lVar13 = lVar15;
  }
  if (lVar11 <= lVar15) {
    lVar11 = lVar15;
  }
  HVar4 = this->m_horizontalFill;
  lVar15 = 0xffffffff01;
  lVar21 = lVar15;
  if (HVar4 == FILL_LEFT) {
    lVar21 = 0xffffffff00;
  }
  lVar23 = -(ulong)(HVar4 == FILL_LEFT);
  if (lVar27 < 0) {
    lVar23 = lVar21;
  }
  VVar5 = this->m_verticalFill;
  if (VVar5 == FILL_BOTTOM) {
    lVar15 = 0xffffffff00;
  }
  lVar21 = -(ulong)(VVar5 == FILL_BOTTOM);
  if (lVar13 < 0) {
    lVar21 = lVar15;
  }
  uVar24 = (ulong)(HVar4 == FILL_RIGHT) + 0xff;
  if (lVar19 < 0) {
    uVar24 = (ulong)(HVar4 == FILL_RIGHT);
  }
  uVar22 = (ulong)(VVar5 == FILL_TOP) + 0xff;
  if (lVar11 < 0) {
    uVar22 = (ulong)(VVar5 == FILL_TOP);
  }
  iVar20 = (this->m_viewport).m_data[0];
  iVar6 = (this->m_viewport).m_data[1];
  iVar18 = (this->m_viewport).m_data[2] + iVar20 + -1;
  iVar12 = (int)((ulong)(lVar23 + lVar27) >> 8);
  iVar16 = iVar18;
  if (iVar12 < iVar18) {
    iVar16 = iVar12;
  }
  iVar25 = (this->m_viewport).m_data[3] + iVar6 + -1;
  if (iVar12 < iVar20) {
    iVar16 = iVar20;
  }
  iVar14 = (int)((ulong)(lVar21 + lVar13) >> 8);
  iVar12 = iVar25;
  if (iVar14 < iVar25) {
    iVar12 = iVar14;
  }
  if (iVar14 < iVar6) {
    iVar12 = iVar6;
  }
  iVar14 = (int)(uVar24 + lVar19 >> 8);
  if (iVar14 < iVar18) {
    iVar18 = iVar14;
  }
  if (iVar14 < iVar20) {
    iVar18 = iVar20;
  }
  (this->m_bboxMin).m_data[0] = iVar16;
  iVar20 = (int)(uVar22 + lVar11 >> 8);
  if (iVar20 < iVar25) {
    iVar25 = iVar20;
  }
  (this->m_bboxMin).m_data[1] = iVar12;
  if (iVar20 < iVar6) {
    iVar25 = iVar6;
  }
  (this->m_bboxMax).m_data[0] = iVar18;
  (this->m_bboxMax).m_data[1] = iVar25;
  uVar10 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar10;
  return (int)uVar10;
}

Assistant:

void TriangleRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2)
{
	m_v0 = v0;
	m_v1 = v1;
	m_v2 = v2;

	// Positions in fixed-point coordinates.
	const deInt64	x0		= toSubpixelCoord(v0.x());
	const deInt64	y0		= toSubpixelCoord(v0.y());
	const deInt64	x1		= toSubpixelCoord(v1.x());
	const deInt64	y1		= toSubpixelCoord(v1.y());
	const deInt64	x2		= toSubpixelCoord(v2.x());
	const deInt64	y2		= toSubpixelCoord(v2.y());

	// Initialize edge functions.
	if (m_winding == WINDING_CCW)
	{
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x0, y0, x1, y1);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x1, y1, x2, y2);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x2, y2, x0, y0);
	}
	else
	{
		// Reverse edges
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x1, y1, x0, y0);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x2, y2, x1, y1);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x0, y0, x2, y2);
	}

	// Determine face.
	const deInt64	s				= evaluateEdge(m_edge01, x2, y2);
	const bool		positiveArea	= (m_winding == WINDING_CCW) ? (s > 0) : (s < 0);

	if (m_viewportOrientation == VIEWPORTORIENTATION_UPPER_LEFT)
		m_face = positiveArea ? FACETYPE_BACK : FACETYPE_FRONT;
	else
		m_face = positiveArea ? FACETYPE_FRONT : FACETYPE_BACK;

	if (!positiveArea)
	{
		// Reverse edges so that we can use CCW area tests & interpolation
		reverseEdge(m_edge01);
		reverseEdge(m_edge12);
		reverseEdge(m_edge20);
	}

	// Bounding box
	const deInt64	xMin	= de::min(de::min(x0, x1), x2);
	const deInt64	xMax	= de::max(de::max(x0, x1), x2);
	const deInt64	yMin	= de::min(de::min(y0, y1), y2);
	const deInt64	yMax	= de::max(de::max(y0, y1), y2);

	m_bboxMin.x() = floorSubpixelToPixelCoord	(xMin, m_horizontalFill	== FILL_LEFT);
	m_bboxMin.y() = floorSubpixelToPixelCoord	(yMin, m_verticalFill	== FILL_BOTTOM);
	m_bboxMax.x() = ceilSubpixelToPixelCoord	(xMax, m_horizontalFill	== FILL_RIGHT);
	m_bboxMax.y() = ceilSubpixelToPixelCoord	(yMax, m_verticalFill	== FILL_TOP);

	// Clamp to viewport
	const int		wX0		= m_viewport.x();
	const int		wY0		= m_viewport.y();
	const int		wX1		= wX0 + m_viewport.z() - 1;
	const int		wY1		= wY0 + m_viewport.w() -1;

	m_bboxMin.x() = de::clamp(m_bboxMin.x(), wX0, wX1);
	m_bboxMin.y() = de::clamp(m_bboxMin.y(), wY0, wY1);
	m_bboxMax.x() = de::clamp(m_bboxMax.x(), wX0, wX1);
	m_bboxMax.y() = de::clamp(m_bboxMax.y(), wY0, wY1);

	m_curPos = m_bboxMin;
}